

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

size_type cmSystemToolsFindRPath(string_view *have,string_view *want)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  size_type sVar1;
  size_type sVar2;
  const_reference pvVar3;
  size_type sVar4;
  size_type end;
  size_type beg;
  size_type pos;
  string_view *want_local;
  string_view *have_local;
  
  beg = 0;
  while( true ) {
    while( true ) {
      sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(have);
      if (sVar1 <= beg) {
        return 0xffffffffffffffff;
      }
      __str._M_len = want->_M_len;
      __str._M_str = want->_M_str;
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(have,__str,beg);
      if (sVar2 == 0xffffffffffffffff) {
        return 0xffffffffffffffff;
      }
      if ((sVar2 == 0) ||
         (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](have,sVar2 - 1)
         , *pvVar3 == ':')) break;
      beg = sVar2 + 1;
    }
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(want);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(have);
    if (sVar4 <= sVar2 + sVar1) {
      return sVar2;
    }
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](have,sVar2 + sVar1);
    if (*pvVar3 == ':') break;
    beg = sVar2 + 1;
  }
  return sVar2;
}

Assistant:

static std::string::size_type cmSystemToolsFindRPath(
  cm::string_view const& have, cm::string_view const& want)
{
  std::string::size_type pos = 0;
  while (pos < have.size()) {
    // Look for an occurrence of the string.
    std::string::size_type const beg = have.find(want, pos);
    if (beg == std::string::npos) {
      return std::string::npos;
    }

    // Make sure it is separated from preceding entries.
    if (beg > 0 && have[beg - 1] != ':') {
      pos = beg + 1;
      continue;
    }

    // Make sure it is separated from following entries.
    std::string::size_type const end = beg + want.size();
    if (end < have.size() && have[end] != ':') {
      pos = beg + 1;
      continue;
    }

    // Return the position of the path portion.
    return beg;
  }

  // The desired rpath was not found.
  return std::string::npos;
}